

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

int nn_get_arg(nn_parse_context *ctx)

{
  bool bVar1;
  nn_parse_context *ctx_local;
  
  bVar1 = ctx->args_left != 0;
  if (bVar1) {
    ctx->args_left = ctx->args_left + -1;
    ctx->arg = ctx->arg + 1;
    ctx->data = *ctx->arg;
  }
  ctx_local._4_4_ = (uint)bVar1;
  return ctx_local._4_4_;
}

Assistant:

static int nn_get_arg (struct nn_parse_context *ctx)
{
    if (!ctx->args_left)
        return 0;
    ctx->args_left -= 1;
    ctx->arg += 1;
    ctx->data = *ctx->arg;
    return 1;
}